

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_from_sin
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,
          PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  batch *in_RAX;
  undefined1 auVar9 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  
  uVar1 = *(undefined4 *)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  auVar9 = in_ZMM0._0_32_;
  auVar4 = vcmpps_avx(auVar9,auVar10,2);
  auVar13 = vpcmpeqd_avx2(auVar10,auVar10);
  auVar10 = auVar13 & ~auVar4;
  if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0x7f,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar10 >> 0xbf,0) != '\0') ||
      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0') {
    uVar1 = *(undefined4 *)((long)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar12._4_4_ = uVar1;
    auVar12._0_4_ = uVar1;
    auVar12._8_4_ = uVar1;
    auVar12._12_4_ = uVar1;
    auVar12._16_4_ = uVar1;
    auVar12._20_4_ = uVar1;
    auVar12._24_4_ = uVar1;
    auVar12._28_4_ = uVar1;
    auVar10 = vcmpps_avx(auVar12,auVar9,2);
    auVar13 = auVar13 & ~auVar10;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      fVar2 = *(float *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar13._16_4_ = 0x7fffffff;
      auVar13._20_4_ = 0x7fffffff;
      auVar13._24_4_ = 0x7fffffff;
      auVar13._28_4_ = 0x7fffffff;
      auVar10 = vandps_avx(auVar9,auVar13);
      auVar15._8_4_ = 0x3f000000;
      auVar15._0_8_ = 0x3f0000003f000000;
      auVar15._12_4_ = 0x3f000000;
      auVar15._16_4_ = 0x3f000000;
      auVar15._20_4_ = 0x3f000000;
      auVar15._24_4_ = 0x3f000000;
      auVar15._28_4_ = 0x3f000000;
      auVar11 = vcmpps_avx(auVar15,auVar10,1);
      auVar14._8_4_ = 0x3f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._12_4_ = 0x3f800000;
      auVar14._16_4_ = 0x3f800000;
      auVar14._20_4_ = 0x3f800000;
      auVar14._24_4_ = 0x3f800000;
      auVar14._28_4_ = 0x3f800000;
      auVar13 = vsubps_avx(auVar14,auVar10);
      auVar5._4_4_ = auVar13._4_4_ * 0.5;
      auVar5._0_4_ = auVar13._0_4_ * 0.5;
      auVar5._8_4_ = auVar13._8_4_ * 0.5;
      auVar5._12_4_ = auVar13._12_4_ * 0.5;
      auVar5._16_4_ = auVar13._16_4_ * 0.5;
      auVar5._20_4_ = auVar13._20_4_ * 0.5;
      auVar5._24_4_ = auVar13._24_4_ * 0.5;
      auVar5._28_4_ = 0x3f000000;
      auVar7._4_4_ = in_ZMM0._4_4_ * in_ZMM0._4_4_;
      auVar7._0_4_ = in_ZMM0._0_4_ * in_ZMM0._0_4_;
      auVar7._8_4_ = in_ZMM0._8_4_ * in_ZMM0._8_4_;
      auVar7._12_4_ = in_ZMM0._12_4_ * in_ZMM0._12_4_;
      auVar7._16_4_ = in_ZMM0._16_4_ * in_ZMM0._16_4_;
      auVar7._20_4_ = in_ZMM0._20_4_ * in_ZMM0._20_4_;
      auVar7._24_4_ = in_ZMM0._24_4_ * in_ZMM0._24_4_;
      auVar7._28_4_ = auVar13._28_4_;
      auVar13 = vblendvps_avx(auVar7,auVar5,auVar11);
      auVar5 = vsqrtps_avx(auVar13);
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar20._16_4_ = 0x80000000;
      auVar20._20_4_ = 0x80000000;
      auVar20._24_4_ = 0x80000000;
      auVar20._28_4_ = 0x80000000;
      auVar5 = vblendvps_avx(auVar10,auVar5,auVar11);
      auVar16._8_4_ = 0x3cc617e3;
      auVar16._0_8_ = 0x3cc617e33cc617e3;
      auVar16._12_4_ = 0x3cc617e3;
      auVar16._16_4_ = 0x3cc617e3;
      auVar16._20_4_ = 0x3cc617e3;
      auVar16._24_4_ = 0x3cc617e3;
      auVar16._28_4_ = 0x3cc617e3;
      auVar21._8_4_ = 0x3d2cb352;
      auVar21._0_8_ = 0x3d2cb3523d2cb352;
      auVar21._12_4_ = 0x3d2cb352;
      auVar21._16_4_ = 0x3d2cb352;
      auVar21._20_4_ = 0x3d2cb352;
      auVar21._24_4_ = 0x3d2cb352;
      auVar21._28_4_ = 0x3d2cb352;
      auVar10 = vandps_avx(auVar20,auVar9);
      auVar6 = vfmadd213ps_fma(auVar21,auVar13,auVar16);
      auVar17._8_4_ = 0x3d3a3ec7;
      auVar17._0_8_ = 0x3d3a3ec73d3a3ec7;
      auVar17._12_4_ = 0x3d3a3ec7;
      auVar17._16_4_ = 0x3d3a3ec7;
      auVar17._20_4_ = 0x3d3a3ec7;
      auVar17._24_4_ = 0x3d3a3ec7;
      auVar17._28_4_ = 0x3d3a3ec7;
      auVar6 = vfmadd231ps_fma(auVar17,auVar13,ZEXT1632(auVar6));
      auVar22._8_4_ = 0x3d9980f6;
      auVar22._0_8_ = 0x3d9980f63d9980f6;
      auVar22._12_4_ = 0x3d9980f6;
      auVar22._16_4_ = 0x3d9980f6;
      auVar22._20_4_ = 0x3d9980f6;
      auVar22._24_4_ = 0x3d9980f6;
      auVar22._28_4_ = 0x3d9980f6;
      auVar6 = vfmadd231ps_fma(auVar22,auVar13,ZEXT1632(auVar6));
      auVar18._8_4_ = 0x3e2aaae4;
      auVar18._0_8_ = 0x3e2aaae43e2aaae4;
      auVar18._12_4_ = 0x3e2aaae4;
      auVar18._16_4_ = 0x3e2aaae4;
      auVar18._20_4_ = 0x3e2aaae4;
      auVar18._24_4_ = 0x3e2aaae4;
      auVar18._28_4_ = 0x3e2aaae4;
      auVar6 = vfmadd231ps_fma(auVar18,auVar13,ZEXT1632(auVar6));
      auVar8._4_4_ = auVar13._4_4_ * auVar5._4_4_;
      auVar8._0_4_ = auVar13._0_4_ * auVar5._0_4_;
      auVar8._8_4_ = auVar13._8_4_ * auVar5._8_4_;
      auVar8._12_4_ = auVar13._12_4_ * auVar5._12_4_;
      auVar8._16_4_ = auVar13._16_4_ * auVar5._16_4_;
      auVar8._20_4_ = auVar13._20_4_ * auVar5._20_4_;
      auVar8._24_4_ = auVar13._24_4_ * auVar5._24_4_;
      auVar8._28_4_ = auVar13._28_4_;
      auVar6 = vfmadd213ps_fma(auVar8,ZEXT1632(auVar6),auVar5);
      auVar19._8_4_ = 0x3fc90fdb;
      auVar19._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar19._12_4_ = 0x3fc90fdb;
      auVar19._16_4_ = 0x3fc90fdb;
      auVar19._20_4_ = 0x3fc90fdb;
      auVar19._24_4_ = 0x3fc90fdb;
      auVar19._28_4_ = 0x3fc90fdb;
      auVar13 = vsubps_avx(auVar19,ZEXT1632(CONCAT412(auVar6._12_4_ + auVar6._12_4_,
                                                      CONCAT48(auVar6._8_4_ + auVar6._8_4_,
                                                               CONCAT44(auVar6._4_4_ + auVar6._4_4_,
                                                                        auVar6._0_4_ + auVar6._0_4_)
                                                              ))));
      auVar13 = vblendvps_avx(ZEXT1632(auVar6),auVar13,auVar11);
      fVar3 = *(float *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar11._0_4_ = fVar2 * (float)(auVar10._0_4_ ^ auVar13._0_4_) + fVar3;
      auVar11._4_4_ = fVar2 * (float)(auVar10._4_4_ ^ auVar13._4_4_) + fVar3;
      auVar11._8_4_ = fVar2 * (float)(auVar10._8_4_ ^ auVar13._8_4_) + fVar3;
      auVar11._12_4_ = fVar2 * (float)(auVar10._12_4_ ^ auVar13._12_4_) + fVar3;
      auVar11._16_4_ = fVar2 * (float)(auVar10._16_4_ ^ auVar13._16_4_) + fVar3;
      auVar11._20_4_ = fVar2 * (float)(auVar10._20_4_ ^ auVar13._20_4_) + fVar3;
      auVar11._24_4_ = fVar2 * (float)(auVar10._24_4_ ^ auVar13._24_4_) + fVar3;
      auVar11._28_4_ = fVar2 + fVar3;
      auVar10 = vcmpps_avx(auVar12,auVar9,6);
      auVar10 = vandps_avx(auVar10,auVar11);
      vblendvps_avx(auVar10,auVar14,auVar4);
    }
  }
  return in_RAX;
}

Assistant:

inline batch<float, A> broadcast(float val, requires_arch<avx>) noexcept
        {
            return _mm256_set1_ps(val);
        }